

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_info_copy(LodePNGInfo *dest,LodePNGInfo *source)

{
  size_t __size;
  size_t sVar1;
  char **ppcVar2;
  char **ppcVar3;
  size_t sVar4;
  char **ppcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char **ppcVar8;
  undefined8 uVar9;
  uchar *puVar10;
  uchar *puVar11;
  uchar *puVar12;
  uchar *puVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  uint uVar17;
  undefined4 uVar18;
  LodePNGColorType LVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  undefined4 uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  undefined4 uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uchar *puVar44;
  ulong uVar45;
  size_t sVar46;
  uint i;
  long lVar47;
  undefined1 auVar48 [32];
  
  lodepng_info_cleanup(dest);
  uVar43 = source->filter_method;
  uVar17 = source->interlace_method;
  uVar18 = *(undefined4 *)&source->field_0xc;
  LVar19 = (source->color).colortype;
  uVar20 = (source->color).bitdepth;
  puVar44 = (source->color).palette;
  sVar46 = (source->color).palettesize;
  uVar21 = (source->color).key_defined;
  uVar22 = (source->color).key_r;
  uVar23 = (source->color).key_g;
  uVar24 = (source->color).key_b;
  uVar25 = source->background_defined;
  uVar26 = source->background_r;
  uVar41 = source->background_g;
  uVar42 = source->background_b;
  sVar1 = source->text_num;
  ppcVar2 = source->text_keys;
  ppcVar3 = source->text_strings;
  sVar4 = source->itext_num;
  ppcVar5 = source->itext_keys;
  ppcVar6 = source->itext_langtags;
  ppcVar7 = source->itext_transkeys;
  ppcVar8 = source->itext_strings;
  uVar31 = source->time_defined;
  uVar32 = (source->time).year;
  uVar33 = (source->time).month;
  uVar34 = (source->time).day;
  uVar35 = (source->time).hour;
  uVar36 = (source->time).minute;
  uVar9 = *(undefined8 *)&(source->time).second;
  uVar37 = source->phys_x;
  uVar38 = source->phys_y;
  uVar39 = source->phys_unit;
  uVar40 = *(undefined4 *)&source->field_0xb4;
  puVar10 = source->unknown_chunks_data[0];
  uVar27 = source->phys_x;
  uVar28 = source->phys_y;
  uVar29 = source->phys_unit;
  uVar30 = *(undefined4 *)&source->field_0xb4;
  puVar11 = source->unknown_chunks_data[0];
  puVar12 = source->unknown_chunks_data[1];
  puVar13 = source->unknown_chunks_data[2];
  sVar14 = source->unknown_chunks_size[0];
  sVar15 = source->unknown_chunks_size[1];
  sVar16 = source->unknown_chunks_size[2];
  dest->compression_method = source->compression_method;
  dest->filter_method = uVar43;
  dest->interlace_method = uVar17;
  *(undefined4 *)&dest->field_0xc = uVar18;
  (dest->color).colortype = LVar19;
  (dest->color).bitdepth = uVar20;
  (dest->color).palette = puVar44;
  (dest->color).palettesize = sVar46;
  (dest->color).key_defined = uVar21;
  (dest->color).key_r = uVar22;
  (dest->color).key_g = uVar23;
  (dest->color).key_b = uVar24;
  dest->background_defined = uVar25;
  dest->background_r = uVar26;
  dest->phys_x = uVar27;
  dest->phys_y = uVar28;
  dest->phys_unit = uVar29;
  *(undefined4 *)&dest->field_0xb4 = uVar30;
  dest->unknown_chunks_data[0] = puVar11;
  dest->unknown_chunks_data[1] = puVar12;
  dest->unknown_chunks_data[2] = puVar13;
  dest->unknown_chunks_size[0] = sVar14;
  dest->unknown_chunks_size[1] = sVar15;
  dest->unknown_chunks_size[2] = sVar16;
  dest->itext_strings = ppcVar8;
  dest->time_defined = uVar31;
  (dest->time).year = uVar32;
  (dest->time).month = uVar33;
  (dest->time).day = uVar34;
  (dest->time).hour = uVar35;
  (dest->time).minute = uVar36;
  *(undefined8 *)&(dest->time).second = uVar9;
  dest->phys_x = uVar37;
  dest->phys_y = uVar38;
  dest->phys_unit = uVar39;
  *(undefined4 *)&dest->field_0xb4 = uVar40;
  dest->unknown_chunks_data[0] = puVar10;
  dest->background_g = uVar41;
  dest->background_b = uVar42;
  dest->text_num = sVar1;
  dest->text_keys = ppcVar2;
  dest->text_strings = ppcVar3;
  dest->itext_num = sVar4;
  dest->itext_keys = ppcVar5;
  dest->itext_langtags = ppcVar6;
  dest->itext_transkeys = ppcVar7;
  (dest->color).colortype = LCT_RGBA;
  (dest->color).bitdepth = 8;
  (dest->color).palette = (uchar *)0x0;
  (dest->color).palettesize = 0;
  (dest->color).key_defined = 0;
  (dest->color).key_r = 0;
  (dest->color).key_g = 0;
  (dest->color).key_b = 0;
  uVar43 = lodepng_color_mode_copy(&dest->color,&source->color);
  if (uVar43 == 0) {
    dest->text_num = 0;
    dest->text_keys = (char **)0x0;
    dest->text_strings = (char **)0x0;
    if (source->text_num != 0) {
      sVar46 = 0;
      do {
        uVar43 = lodepng_add_text(dest,source->text_keys[sVar46],source->text_strings[sVar46]);
        if (uVar43 != 0) goto LAB_002dc77b;
        sVar46 = sVar46 + 1;
      } while (sVar46 != source->text_num);
    }
    uVar43 = 0;
LAB_002dc77b:
    if (uVar43 == 0) {
      auVar48 = ZEXT1632(ZEXT816(0) << 0x40);
      dest->itext_num = auVar48._0_8_;
      dest->itext_keys = (char **)auVar48._8_8_;
      dest->itext_langtags = (char **)auVar48._16_8_;
      dest->itext_transkeys = (char **)auVar48._24_8_;
      dest->itext_strings = (char **)0x0;
      if (source->itext_num != 0) {
        sVar46 = 0;
        do {
          uVar43 = lodepng_add_itext(dest,source->itext_keys[sVar46],source->itext_langtags[sVar46],
                                     source->itext_transkeys[sVar46],source->itext_strings[sVar46]);
          if (uVar43 != 0) goto LAB_002dc7e9;
          sVar46 = sVar46 + 1;
        } while (sVar46 != source->itext_num);
      }
      uVar43 = 0;
LAB_002dc7e9:
      if (uVar43 == 0) {
        dest->unknown_chunks_data[2] = (uchar *)0x0;
        dest->unknown_chunks_size[0] = 0;
        dest->unknown_chunks_size[1] = 0;
        dest->unknown_chunks_size[2] = 0;
        dest->unknown_chunks_data[0] = (uchar *)0x0;
        dest->unknown_chunks_data[1] = (uchar *)0x0;
        dest->unknown_chunks_data[2] = (uchar *)0x0;
        dest->unknown_chunks_size[0] = 0;
        lVar47 = 0;
        do {
          free(dest->unknown_chunks_data[lVar47]);
          lVar47 = lVar47 + 1;
        } while (lVar47 != 3);
        lVar47 = 0;
        do {
          sVar46 = source->unknown_chunks_size[lVar47];
          dest->unknown_chunks_size[lVar47] = sVar46;
          __size = source->unknown_chunks_size[lVar47];
          puVar44 = (uchar *)malloc(__size);
          dest->unknown_chunks_data[lVar47] = puVar44;
          if (sVar46 != 0 && puVar44 == (uchar *)0x0) {
            return 0x53;
          }
          if (__size != 0) {
            uVar45 = 0;
            do {
              dest->unknown_chunks_data[lVar47][uVar45] =
                   source->unknown_chunks_data[lVar47][uVar45];
              uVar45 = uVar45 + 1;
            } while (uVar45 < source->unknown_chunks_size[lVar47]);
          }
          lVar47 = lVar47 + 1;
          uVar43 = 0;
        } while (lVar47 != 3);
      }
    }
  }
  return uVar43;
}

Assistant:

unsigned lodepng_info_copy(LodePNGInfo* dest, const LodePNGInfo* source)
{
  lodepng_info_cleanup(dest);
  *dest = *source;
  lodepng_color_mode_init(&dest->color);
  CERROR_TRY_RETURN(lodepng_color_mode_copy(&dest->color, &source->color));

#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  CERROR_TRY_RETURN(LodePNGText_copy(dest, source));
  CERROR_TRY_RETURN(LodePNGIText_copy(dest, source));

  LodePNGUnknownChunks_init(dest);
  CERROR_TRY_RETURN(LodePNGUnknownChunks_copy(dest, source));
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
  return 0;
}